

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::normalizeOffset(DateTimePickerPrivate *this,int section)

{
  QVector<Section> *this_00;
  Section *pSVar1;
  int iVar2;
  reference pSVar3;
  int iVar4;
  int iVar5;
  long i;
  int iVar6;
  
  i = (long)section;
  pSVar1 = (this->super_DateTimeParser).sections.d.ptr;
  iVar6 = pSVar1[i].offset;
  iVar5 = this->itemTopMargin + this->itemHeight;
  iVar2 = -iVar6;
  if (0 < iVar6) {
    iVar2 = iVar6;
  }
  if (iVar5 / 2 < iVar2) {
    this_00 = &(this->super_DateTimeParser).sections;
    iVar2 = (int)pSVar1[i].values.d.size;
    do {
      if (iVar6 < 1) {
        if (iVar2 < this->itemsMaxCount) {
          pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
          iVar6 = pSVar3->currentIndex;
          pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
          if ((pSVar3->values).d.size + -1 == (long)iVar6) goto LAB_001591e4;
        }
        pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
        pSVar3->offset = pSVar3->offset + iVar5;
        iVar4 = (this->super_DateTimeParser).sections.d.ptr[i].currentIndex;
        iVar6 = iVar4 + 1;
        if (iVar2 + -1 == iVar4) {
          iVar6 = 0;
        }
      }
      else {
        if ((iVar2 < this->itemsMaxCount) &&
           (pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i), pSVar3->currentIndex == 0))
        {
LAB_001591e4:
          pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
          pSVar3->offset = 0;
          return;
        }
        pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
        pSVar3->offset = pSVar3->offset - iVar5;
        iVar6 = (this->super_DateTimeParser).sections.d.ptr[i].currentIndex;
        if (iVar6 == 0) {
          iVar6 = iVar2;
        }
        iVar6 = iVar6 + -1;
      }
      pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
      pSVar3->currentIndex = iVar6;
      iVar6 = (this->super_DateTimeParser).sections.d.ptr[i].offset;
      iVar4 = -iVar6;
      if (0 < iVar6) {
        iVar4 = iVar6;
      }
    } while (iVar5 / 2 < iVar4);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::normalizeOffset( int section )
{
	const int sectionValuesSize = sections.at( section ).values.size();
	const int totalItemHeight = itemHeight + itemTopMargin;

	while( qAbs( sections.at( section ).offset ) > totalItemHeight / 2 )
	{
		if( sections.at( section ).offset > 0 )
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex == 0 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset -= totalItemHeight;
			sections[ section ].currentIndex = prevIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
		else
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex ==
					sections[ section ].values.size() - 1 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset += totalItemHeight;
			sections[ section ].currentIndex = nextIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
	}
}